

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ADIOSTypes.cpp
# Opt level: O3

void adios2::PrintMVI(ostream *os,MinVarInfo *mvi)

{
  uint uVar1;
  pointer pMVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  MinBlockInfo *blk;
  long lVar6;
  pointer pMVar7;
  ulong uVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Step: ",6);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  Dims: ",8);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,mvi->Dims);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," Shape: {",9);
  if ((mvi->Dims == 0) || (mvi->Shape == (size_t *)0x0)) {
    std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
  }
  else if (0 < mvi->Dims) {
    lVar6 = 0;
    do {
      std::ostream::_M_insert<unsigned_long>((ulong)os);
      iVar3 = mvi->Dims;
      if (lVar6 < (long)iVar3 + -1) {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        iVar3 = mvi->Dims;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"}, BlockCount: ",0xf);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
  pMVar7 = (mvi->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar2 = (mvi->BlocksInfo).
           super__Vector_base<adios2::MinBlockInfo,_std::allocator<adios2::MinBlockInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pMVar7 == pMVar2) {
      std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
      std::ostream::put((char)os);
      std::ostream::flush();
      return;
    }
    uVar1 = mvi->Dims;
    uVar5 = (ulong)uVar1;
    std::__ostream_insert<char,std::char_traits<char>>(os,"Writer: ",8);
    poVar4 = (ostream *)std::ostream::operator<<(os,pMVar7->WriterID);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Blk: ",7);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", Start: {",10);
    if ((uVar5 == 0) || (pMVar7->Start == (size_t *)0x0)) {
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
LAB_0033a194:
      std::__ostream_insert<char,std::char_traits<char>>(os,"}, Count: {",0xb);
      if (uVar5 != 0) goto LAB_0033a1c3;
LAB_0033a206:
      std::__ostream_insert<char,std::char_traits<char>>(os,"NULL",4);
    }
    else {
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          std::ostream::_M_insert<unsigned_long>((ulong)os);
          if (uVar8 < uVar1 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
        goto LAB_0033a194;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,"}, Count: {",0xb);
LAB_0033a1c3:
      if (pMVar7->Count == (size_t *)0x0) goto LAB_0033a206;
      if (0 < (int)uVar1) {
        uVar8 = 0;
        do {
          std::ostream::_M_insert<unsigned_long>((ulong)os);
          if (uVar8 < uVar1 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
          }
          uVar8 = uVar8 + 1;
        } while (uVar5 != uVar8);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"}, Data: ",9);
    poVar4 = std::ostream::_M_insert<void_const*>(os);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pMVar7 = pMVar7 + 1;
  } while( true );
}

Assistant:

void PrintMVI(std::ostream &os, const MinVarInfo &mvi)
{
    os << "Step: " << mvi.Step << "  Dims: " << mvi.Dims << " Shape: {";
    if ((mvi.Dims == 0) || (mvi.Shape == NULL))
        os << "NULL";
    else
    {
        for (int i = 0; i < mvi.Dims; i++)
        {
            os << mvi.Shape[i];
            if (i < mvi.Dims - 1)
                os << ", ";
        }
    }
    os << "}, BlockCount: " << mvi.BlocksInfo.size() << " ";
    for (const auto &blk : mvi.BlocksInfo)
        PrintMBI(os, blk, mvi.Dims);
    os << std::endl;
}